

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

S2Point * __thiscall S2LaxPolygonShape::loop_vertex(S2LaxPolygonShape *this,int i,int j)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  int local_20;
  int local_1c;
  int j_local;
  int i_local;
  S2LaxPolygonShape *this_local;
  
  local_20 = j;
  local_1c = i;
  _j_local = this;
  iVar1 = num_loops(this);
  local_39 = 0;
  if (iVar1 <= i) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x79,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar3 = S2LogMessage::stream(&local_38);
    poVar3 = std::operator<<(poVar3,"Check failed: (i) < (num_loops()) ");
    S2LogMessageVoidify::operator&(&local_21,poVar3);
  }
  iVar1 = local_20;
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  iVar2 = num_loop_vertices(this,local_1c);
  if (iVar2 <= iVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x7a,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_60);
    poVar3 = std::operator<<(poVar3,"Check failed: (j) < (num_loop_vertices(i)) ");
    S2LogMessageVoidify::operator&(local_4d,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  iVar1 = num_loops(this);
  if (iVar1 == 1) {
    this_local = (S2LaxPolygonShape *)
                 std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::
                 operator[](&this->vertices_,(long)local_20);
  }
  else {
    this_local = (S2LaxPolygonShape *)
                 std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::
                 operator[](&this->vertices_,
                            (ulong)((this->field_2).cumulative_vertices_[local_1c] + local_20));
  }
  return (S2Point *)this_local;
}

Assistant:

const S2Point& S2LaxPolygonShape::loop_vertex(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  if (num_loops() == 1) {
    return vertices_[j];
  } else {
    return vertices_[cumulative_vertices_[i] + j];
  }
}